

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O3

int get_src_border_in_pixels(AV1_COMP *cpi,BLOCK_SIZE sb_size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  if ((((cpi->oxcf).mode == '\x01') && ((cpi->oxcf).resize_cfg.resize_mode == '\0')) &&
     ((cpi->oxcf).superres_cfg.superres_mode == AOM_SUPERRES_NONE)) {
    iVar3 = 4 << (""[sb_size] & 0x1f);
    iVar1 = (cpi->oxcf).frm_dim_cfg.width;
    iVar2 = (cpi->oxcf).frm_dim_cfg.height;
    uVar4 = (((iVar3 + iVar1) - 1U & -iVar3) - iVar1) + 0x1f;
    uVar5 = (((iVar3 + iVar2) - 1U & -iVar3) - iVar2) + 0x1f;
    if ((int)uVar5 < (int)uVar4) {
      uVar5 = uVar4;
    }
    uVar4 = 0x20;
    if (0x20 < (int)(uVar5 & 0xffffffe0)) {
      uVar4 = uVar5 & 0xffffffe0;
    }
    return uVar4;
  }
  return (cpi->oxcf).border_in_pixels;
}

Assistant:

static inline int get_src_border_in_pixels(AV1_COMP *cpi, BLOCK_SIZE sb_size) {
  if (cpi->oxcf.mode != REALTIME || av1_is_resize_needed(&cpi->oxcf))
    return cpi->oxcf.border_in_pixels;

  const int sb_size_in_pixels_log2 = mi_size_wide_log2[sb_size] + MI_SIZE_LOG2;
  const int sb_aligned_width =
      ALIGN_POWER_OF_TWO(cpi->oxcf.frm_dim_cfg.width, sb_size_in_pixels_log2);
  const int sb_aligned_height =
      ALIGN_POWER_OF_TWO(cpi->oxcf.frm_dim_cfg.height, sb_size_in_pixels_log2);
  // Align the border pixels to a multiple of 32.
  const int border_pixels_width =
      ALIGN_POWER_OF_TWO(sb_aligned_width - cpi->oxcf.frm_dim_cfg.width, 5);
  const int border_pixels_height =
      ALIGN_POWER_OF_TWO(sb_aligned_height - cpi->oxcf.frm_dim_cfg.height, 5);
  const int border_in_pixels =
      AOMMAX(AOMMAX(border_pixels_width, border_pixels_height), 32);
  return border_in_pixels;
}